

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

ostream * Kernel::operator<<(ostream *out,Clause *self)

{
  SplitSet *pSVar1;
  ostream *poVar2;
  long lVar3;
  
  if ((*(uint *)&self->field_0x38 & 0xfffff) != 0) {
    operator<<(out,self->_literals[0]);
    for (lVar3 = 0xf; lVar3 - 0xeU < (ulong)((uint)*(undefined8 *)&self->field_0x38 & 0xfffff);
        lVar3 = lVar3 + 1) {
      poVar2 = std::operator<<(out," | ");
      operator<<(poVar2,self->_literals[lVar3 + -0xe]);
    }
    pSVar1 = (self->super_Unit)._inference._splits;
    if ((pSVar1 != (SplitSet *)0x0) && (pSVar1->_size != 0)) {
      poVar2 = std::operator<<(out,"{");
      poVar2 = Lib::operator<<(poVar2,(self->super_Unit)._inference._splits);
      std::operator<<(poVar2,"}");
    }
    return out;
  }
  poVar2 = std::operator<<(out,"$false");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Clause const& self)
{
  if (self.size() == 0) {
    return out << "$false";
  } else {
    out << *self[0];
    for (unsigned i = 1; i < self.size(); i++){
      out << " | " << *self[i];
    }
    if (self.splits() && !self.splits()->isEmpty()) {
      out << "{" << *self.splits() << "}";
    }
  }
  return out;
}